

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall dh::analysis::match(analysis *this,string *c)

{
  __type _Var1;
  int iVar2;
  ostream *poVar3;
  element_type *peVar4;
  token local_90;
  token local_60;
  undefined1 local_38 [40];
  string *c_local;
  analysis *this_local;
  
  local_38._32_8_ = c;
  c_local = (string *)this;
  std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)&this->tmp)
  ;
  token::getVal_abi_cxx11_((token *)local_38);
  _Var1 = std::operator==(c,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38);
  std::__cxx11::string::~string((string *)local_38);
  if (!_Var1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"[ERROR] Incompitable word: \"");
    std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &this->tmp);
    token::getVal_abi_cxx11_(&local_90);
    poVar3 = std::operator<<(poVar3,(string *)&local_90);
    poVar3 = std::operator<<(poVar3,"\" in line ");
    peVar4 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->tmp);
    iVar2 = token::getLineno(peVar4);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," expect token: \"");
    poVar3 = std::operator<<(poVar3,(string *)c);
    std::operator<<(poVar3,"\"\n");
    std::__cxx11::string::~string((string *)&local_90);
    exit(1);
  }
  scanner::getToken(&local_60,&this->_tokens);
  peVar4 = std::__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<dh::token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->tmp);
  token::operator=(peVar4,&local_60);
  token::~token(&local_60);
  return;
}

Assistant:

void analysis::match( ::std::string c)
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG IN Match] get " 
		<< tmp->getVal() 
		<< " need " 
		<< c 
		<< ::std::endl;
#endif
	if ( c == tmp->getVal())
	{
		*tmp = _tokens.getToken();
		return ;
	} else 
	{
		::std::cerr << "[ERROR] Incompitable word: \""
			<< tmp->getVal() 
			<< "\" in line "
			<< tmp->getLineno()
			<< " expect token: \""
			<< c
			<< "\"\n";
		::std::exit(1);
	}
}